

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void pick_machine(string *name)

{
  FILE *__stream;
  bool bVar1;
  char *pcVar2;
  machine *__p;
  undefined8 uVar3;
  exception *exception;
  string *name_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = testbench::machine::availability::is(pcVar2);
  __stream = _stderr;
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    __p = testbench::machine::create(pcVar2);
    std::unique_ptr<testbench::machine,_std::default_delete<testbench::machine>_>::reset
              (&machine,__p);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&machine);
    if (!bVar1) {
      fputs("Error initializing machine\n",_stderr);
      exit(1);
    }
  }
  else {
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"Unkown machine: %s\n",uVar3);
  }
  return;
}

Assistant:

static void pick_machine(std::string name)
{
    if (testbench::machine::available.is(name.c_str())) {
        try {
            machine.reset(testbench::machine::create(name.c_str()));
        }
        catch (const std::exception& exception) {
            fprintf(stderr, "Error: %s\n", exception.what());
        }
        if (not machine) {
            fputs("Error initializing machine\n", stderr);
            exit(1);
        }
    }
    else {
        fprintf(stderr, "Unkown machine: %s\n", name.c_str());
    }
}